

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O2

string * __thiscall
fasttext::Args::modelToString_abi_cxx11_(string *__return_storage_ptr__,Args *this,model_name mn)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  if (mn == sup) {
    __s = "sup";
    __a = &local_b;
  }
  else if (mn == sg) {
    __s = "sg";
    __a = &local_a;
  }
  else if (mn == cbow) {
    __s = "cbow";
    __a = &local_9;
  }
  else {
    __s = "Unknown model name!";
    __a = &local_c;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string Args::modelToString(model_name mn) const {
  switch (mn) {
    case model_name::cbow:
      return "cbow";
    case model_name::sg:
      return "sg";
    case model_name::sup:
      return "sup";
  }
  return "Unknown model name!"; // should never happen
}